

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PClass::InsertIntoHash(PClass *this)

{
  PType *pPVar1;
  PType *pPVar2;
  PType *pPVar3;
  PType **ppPVar4;
  long parm2;
  size_t bucket;
  size_t local_20;
  
  pPVar1 = FTypeTable::FindType
                     (&TypeTable,RegistrationInfo.MyClass,
                      (intptr_t)(this->super_PStruct).super_PNamedType.Outer,
                      (long)(this->super_PStruct).super_PNamedType.TypeName.Index,&local_20);
  parm2 = (long)(this->super_PStruct).super_PNamedType.TypeName.Index;
  if (pPVar1 == (PType *)0x0) {
    FTypeTable::AddType(&TypeTable,(PType *)this,RegistrationInfo.MyClass,
                        (intptr_t)(this->super_PStruct).super_PNamedType.Outer,parm2,local_20);
  }
  else {
    if (strictdecorate.Value == false) {
      Printf("\x1cGTried to register class \'%s\' more than once.\n",
             FName::NameData.NameArray[parm2].Text);
    }
    else {
      I_Error("Tried to register class \'%s\' more than once.\n");
    }
    pPVar3 = TypeTable.TypeHash[local_20];
    if (pPVar3 != (PType *)0x0) {
      if (pPVar3 == pPVar1) {
        ppPVar4 = TypeTable.TypeHash + local_20;
      }
      else {
        do {
          pPVar2 = pPVar3;
          pPVar3 = pPVar2->HashNext;
          if (pPVar3 == (PType *)0x0) {
            return;
          }
        } while (pPVar3 != pPVar1);
        ppPVar4 = &pPVar2->HashNext;
      }
      (this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.HashNext =
           pPVar3->HashNext;
      pPVar3->HashNext = (PType *)0x0;
      *ppPVar4 = (PType *)this;
    }
  }
  return;
}

Assistant:

void PClass::InsertIntoHash ()
{
	size_t bucket;
	PType *found;

	found = TypeTable.FindType(RUNTIME_CLASS(PClass), (intptr_t)Outer, TypeName, &bucket);
	if (found != NULL)
	{ // This type has already been inserted
	  // ... but there is no need whatsoever to make it a fatal error!
		if (!strictdecorate) Printf (TEXTCOLOR_RED"Tried to register class '%s' more than once.\n", TypeName.GetChars());
		else I_Error("Tried to register class '%s' more than once.\n", TypeName.GetChars());
		TypeTable.ReplaceType(this, found, bucket);
	}
	else
	{
		TypeTable.AddType(this, RUNTIME_CLASS(PClass), (intptr_t)Outer, TypeName, bucket);
	}
}